

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NumberUtilities_strtod.cpp
# Opt level: O1

void __thiscall Js::BIGNUM::MakeLowerBound(BIGNUM *this)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 *puVar4;
  uint uVar5;
  
  if (this->m_luError == 0xffffffff) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Common/NumberUtilities_strtod.cpp"
                                ,0x81,"(m_luError < 0xFFFFFFFF)","m_luError < 0xFFFFFFFF");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  uVar5 = this->m_luError + 1;
  if (1 < uVar5) {
    iVar3 = NumberUtilities::AddLu(&this->m_lu0,-(uVar5 >> 1));
    if (iVar3 == 0) {
      iVar3 = NumberUtilities::AddLu(&this->m_lu1,0xffffffff);
      if (iVar3 == 0) {
        NumberUtilities::AddLu(&this->m_lu2,0xffffffff);
        if (-1 < (int)this->m_lu2) {
          Normalize(this);
        }
      }
    }
  }
  this->m_luError = 0;
  return;
}

Assistant:

void MakeLowerBound(void)
    {
        Assert(m_luError < 0xFFFFFFFF);
        uint32 luT = (m_luError + 1) >> 1;

        if (luT &&
            !Js::NumberUtilities::AddLu(&m_lu0, (uint32)-(int32)luT) &&
            !Js::NumberUtilities::AddLu(&m_lu1, 0xFFFFFFFF))
        {
            Js::NumberUtilities::AddLu(&m_lu2, 0xFFFFFFFF);
            if (0 == (0x80000000 & m_lu2))
                Normalize();
        }
        m_luError = 0;
    }